

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

UINT8 __thiscall GYMPlayer::GetSongInfo(GYMPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    songInf->format = 0x47594d00;
    songInf->fileVerMaj = 0;
    songInf->fileVerMin = 0;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = this->_tickFreq;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if (this->_loopOfs == 0) {
      UVar1 = 0xffffffff;
    }
    else {
      UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])(this);
    }
    songInf->loopTick = UVar1;
    songInf->volGain = 0x10000;
    songInf->deviceCnt =
         (UINT32)((ulong)((long)(this->_devCfgs).
                                super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_devCfgs).
                               super__Vector_base<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
    return '\0';
  }
  return 0xff;
}

Assistant:

UINT8 GYMPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_GYM;
	songInf.fileVerMaj = 0;
	songInf.fileVerMin = 0;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = _tickFreq;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devCfgs.size();
	
	return 0x00;
}